

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O1

void __thiscall TextFile::writeCharacter(TextFile *this,wchar_t character)

{
  ulong uVar1;
  ulong in_RAX;
  size_t __n;
  undefined1 uVar2;
  uchar buffer [4];
  undefined8 uStack_8;
  
  if (this->mode == Write) {
    uVar2 = (undefined1)character;
    uStack_8._0_4_ = (undefined4)in_RAX;
    uStack_8._5_3_ = (undefined3)(in_RAX >> 0x28);
    if (character < L'\x80') {
      uStack_8 = CONCAT35(uStack_8._5_3_,CONCAT14(uVar2,(undefined4)uStack_8)) & 0xffffff7fffffffff;
      __n = 1;
    }
    else if (this->encoding == ASCII) {
      __n = 0;
      uStack_8 = in_RAX;
    }
    else if (character < L'ࠀ') {
      uVar1 = CONCAT35(uStack_8._5_3_,CONCAT14((char)((uint)character >> 6),(undefined4)uStack_8)) &
              0xffffff1fffffffff;
      uStack_8._6_2_ = (undefined2)(uVar1 >> 0x30);
      uStack_8 = CONCAT26(uStack_8._6_2_,CONCAT15(uVar2,(int5)uVar1)) & 0xffff3fffffffffff |
                 0x80c000000000;
      __n = 2;
    }
    else {
      uVar1 = CONCAT35(uStack_8._5_3_,CONCAT14((char)((uint)character >> 0xc),(undefined4)uStack_8))
              & 0xffffff0fffffffff;
      uStack_8._6_2_ = (undefined2)(uVar1 >> 0x30);
      uVar1 = CONCAT26(uStack_8._6_2_,CONCAT15((char)((uint)character >> 6),(int5)uVar1)) &
              0xffff3fffffffffff;
      uStack_8._7_1_ = (undefined1)(uVar1 >> 0x38);
      uStack_8 = CONCAT17(uStack_8._7_1_,CONCAT16(uVar2,(int6)uVar1)) & 0xff3fffffffffffff |
                 0x8080e000000000;
      __n = 3;
    }
    fwrite((void *)((long)&uStack_8 + 4),1,__n,(FILE *)this->handle);
  }
  return;
}

Assistant:

void TextFile::writeCharacter(wchar_t character)
{
	unsigned char buffer[4];
	if (mode != Write) return;

	// only support utf8 for now
	int length = 0;
	if (character < 0x80)
	{
#ifdef WIN32
		if (character == L'\n')
		{
			buffer[length++] = '\r';
		}
#endif
		buffer[length++] = character & 0x7F;
	} else if (encoding != ASCII)
	{
		if (character < 0x800)
		{
			buffer[0] = 0xC0 | ((character >> 6) & 0x1F);
			buffer[1] = 0x80 | (character & 0x3F);
			length = 2;
		} else {
			buffer[0] = 0xE0 | ((character >> 12) & 0xF);
			buffer[1] = 0x80 | ((character >> 6) & 0x3F);
			buffer[2] = 0x80 | (character & 0x3F);
			length = 3;
		}
	}

	fwrite(buffer,1,length,handle);
}